

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

bool __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::validate<false>
          (InputParameter<0UL,_ruckig::StandardVector> *this,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  double __value;
  double __value_00;
  double __value_01;
  double __value_02;
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_> *this_00;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_b8;
  value_type local_ac;
  double local_a8;
  double jMax_1;
  size_t dof_1;
  double vMin;
  double vMax;
  double pf;
  double p0;
  ControlInterface control_interface_;
  double vf;
  double v0;
  double af;
  double a0;
  double aMin;
  double aMax;
  double jMax;
  size_t dof;
  bool check_target_state_within_limits_local;
  bool check_current_state_within_limits_local;
  InputParameter<0UL,_ruckig::StandardVector> *this_local;
  
  jMax = 0.0;
  while( true ) {
    if (this->degrees_of_freedom <= (ulong)jMax) {
      bVar1 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::empty(&this->intermediate_positions);
      if ((!bVar1) && (this->control_interface == Position)) {
        bVar1 = std::optional::operator_cast_to_bool((optional *)&this->minimum_duration);
        if ((bVar1) || (this->duration_discretization != Continuous)) {
          return false;
        }
        bVar1 = std::optional::operator_cast_to_bool((optional *)&this->per_dof_control_interface);
        if ((bVar1) ||
           (bVar1 = std::optional::operator_cast_to_bool((optional *)&this->per_dof_synchronization)
           , bVar1)) {
          return false;
        }
        for (jMax_1 = 0.0; (ulong)jMax_1 < this->degrees_of_freedom;
            jMax_1 = (double)((long)jMax_1 + 1)) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->max_jerk,(size_type)jMax_1);
          uVar2 = std::isinf(*pvVar3);
          if ((uVar2 & 1) != 0) {
            return false;
          }
        }
      }
      return true;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->max_jerk,(size_type)jMax);
    dVar8 = *pvVar3;
    uVar2 = std::isnan(dVar8);
    if (((uVar2 & 1) != 0) || (dVar8 < 0.0)) {
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->max_acceleration,(size_type)jMax);
    dVar7 = *pvVar3;
    uVar2 = std::isnan(dVar7);
    if (((uVar2 & 1) != 0) || (dVar7 < 0.0)) {
      return false;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->min_acceleration);
    if (bVar1) {
      pvVar5 = std::optional<std::vector<double,_std::allocator<double>_>_>::value
                         (&this->min_acceleration);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(size_type)jMax);
      local_a8 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->max_acceleration,(size_type)jMax);
      local_a8 = -*pvVar3;
    }
    uVar2 = std::isnan(local_a8);
    if (((uVar2 & 1) != 0) || (0.0 < local_a8)) {
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->current_acceleration,(size_type)jMax);
    __value = *pvVar3;
    uVar2 = std::isnan(__value);
    if ((uVar2 & 1) != 0) {
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->target_acceleration,(size_type)jMax);
    __value_00 = *pvVar3;
    uVar2 = std::isnan(__value_00);
    if ((uVar2 & 1) != 0) break;
    if (check_current_state_within_limits) {
      if (dVar7 < __value) {
        return false;
      }
      if (__value < local_a8) {
        return false;
      }
    }
    if (check_target_state_within_limits) {
      if (dVar7 < __value_00) {
        return false;
      }
      if (__value_00 < local_a8) {
        return false;
      }
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->current_velocity,(size_type)jMax);
    dVar7 = *pvVar3;
    uVar2 = std::isnan(dVar7);
    if ((uVar2 & 1) != 0) {
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->target_velocity,(size_type)jMax);
    __value_01 = *pvVar3;
    uVar2 = std::isnan(__value_01);
    if ((uVar2 & 1) != 0) {
      return false;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->per_dof_control_interface);
    if (bVar1) {
      this_00 = std::
                optional<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
                ::value(&this->per_dof_control_interface);
      pvVar4 = std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>::
               operator[](this_00,(size_type)jMax);
      local_ac = *pvVar4;
    }
    else {
      local_ac = this->control_interface;
    }
    if (local_ac == Position) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->current_position,(size_type)jMax);
      uVar2 = std::isnan(*pvVar3);
      if ((uVar2 & 1) != 0) {
        return false;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->target_position,(size_type)jMax);
      uVar2 = std::isnan(*pvVar3);
      if ((uVar2 & 1) != 0) {
        return false;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->max_velocity,(size_type)jMax);
      __value_02 = *pvVar3;
      uVar2 = std::isnan(__value_02);
      if (((uVar2 & 1) != 0) || (__value_02 < 0.0)) {
        return false;
      }
      bVar1 = std::optional::operator_cast_to_bool((optional *)&this->min_velocity);
      if (bVar1) {
        pvVar5 = std::optional<std::vector<double,_std::allocator<double>_>_>::value
                           (&this->min_velocity);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(size_type)jMax);
        local_b8 = *pvVar3;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->max_velocity,(size_type)jMax);
        local_b8 = -*pvVar3;
      }
      uVar2 = std::isnan(local_b8);
      if (((uVar2 & 1) != 0) || (0.0 < local_b8)) {
        return false;
      }
      if (check_current_state_within_limits) {
        if (__value_02 < dVar7) {
          return false;
        }
        if (dVar7 < local_b8) {
          return false;
        }
      }
      if (check_target_state_within_limits) {
        if (__value_02 < __value_01) {
          return false;
        }
        if (__value_01 < local_b8) {
          return false;
        }
      }
      if (check_current_state_within_limits) {
        if (((0.0 < __value) && (0.0 < dVar8)) &&
           (dVar6 = v_at_a_zero(dVar7,__value,dVar8), __value_02 < dVar6)) {
          return false;
        }
        if (((__value < 0.0) && (0.0 < dVar8)) &&
           (dVar7 = v_at_a_zero(dVar7,__value,-dVar8), dVar7 < local_b8)) {
          return false;
        }
      }
      if (check_target_state_within_limits) {
        if (((__value_00 < 0.0) && (0.0 < dVar8)) &&
           (dVar7 = v_at_a_zero(__value_01,__value_00,dVar8), __value_02 < dVar7)) {
          return false;
        }
        if (((0.0 < __value_00) && (0.0 < dVar8)) &&
           (dVar8 = v_at_a_zero(__value_01,__value_00,-dVar8), dVar8 < local_b8)) {
          return false;
        }
      }
    }
    jMax = (double)((long)jMax + 1);
  }
  return false;
}

Assistant:

bool validate(bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const double jMax = max_jerk[dof];
            if (std::isnan(jMax) || jMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum jerk limit " + std::to_string(jMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMax = max_acceleration[dof];
            if (std::isnan(aMax) || aMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum acceleration limit " + std::to_string(aMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMin = min_acceleration ? min_acceleration.value()[dof] : -max_acceleration[dof];
            if (std::isnan(aMin) || aMin > 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("minimum acceleration limit " + std::to_string(aMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                }
                return false;
            }

            const double a0 = current_acceleration[dof];
            if (std::isnan(a0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double af = target_acceleration[dof];
            if (std::isnan(af)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            if (check_current_state_within_limits) {
                if (a0 > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (a0 < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }
            if (check_target_state_within_limits) {
                if (af > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (af < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }

            const double v0 = current_velocity[dof];
            if (std::isnan(v0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double vf = target_velocity[dof];
            if (std::isnan(vf)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            auto control_interface_ = per_dof_control_interface ? per_dof_control_interface.value()[dof] : control_interface;
            if (control_interface_ == ControlInterface::Position) {
                const double p0 = current_position[dof];
                if (std::isnan(p0)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current position " + std::to_string(p0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }
                const double pf = target_position[dof];
                if (std::isnan(pf)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target position " + std::to_string(pf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }

                const double vMax = max_velocity[dof];
                if (std::isnan(vMax) || vMax < 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("maximum velocity limit " + std::to_string(vMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                    }
                    return false;
                }

                const double vMin = min_velocity ? min_velocity.value()[dof] : -max_velocity[dof];
                if (std::isnan(vMin) || vMin > 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("minimum velocity limit " + std::to_string(vMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                    }
                    return false;
                }

                if (check_current_state_within_limits) {
                    if (v0 > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (v0 < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (vf > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (vf < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }

                if (check_current_state_within_limits) {
                    if (a0 > 0 && jMax > 0 && v_at_a_zero(v0, a0, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, jMax)) + " from the current kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (a0 < 0 && jMax > 0 && v_at_a_zero(v0, a0, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, -jMax)) + " from the current kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (af < 0 && jMax > 0 && v_at_a_zero(vf, af, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, jMax)) + " from the target kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (af > 0 && jMax > 0 && v_at_a_zero(vf, af, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, -jMax)) + " from the target kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
            }
        }

        if (!intermediate_positions.empty() && control_interface == ControlInterface::Position) {
            if (minimum_duration || duration_discretization != DurationDiscretization::Continuous) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate position can not be used together with a global minimum or discrete duration.");
                }
                return false;
            }

            if (per_dof_control_interface || per_dof_synchronization) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate positions can only be used together with the position control interface and a global synchronization.");
                }
                return false;
            }

            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                const double jMax = max_jerk[dof];
                if (std::isinf(jMax)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("infinite jerk limit of DoF " + std::to_string(dof) + " is currently not supported with intermediate positions.");
                    }
                    return false;
                }
            }
        }

        return true;
    }